

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

btBvhTriangleMeshShape * __thiscall
btCollisionWorldImporter::createBvhTriangleMeshShape
          (btCollisionWorldImporter *this,btStridingMeshInterface *trimesh,btOptimizedBvh *bvh)

{
  btCollisionShape **ptr;
  uint uVar1;
  btBvhTriangleMeshShape *this_00;
  btCollisionShape **ppbVar2;
  ulong uVar3;
  int iVar4;
  btVector3 local_38;
  
  this_00 = (btBvhTriangleMeshShape *)btAlignedAllocInternal(0x68,0x10);
  if (bvh == (btOptimizedBvh *)0x0) {
    btBvhTriangleMeshShape::btBvhTriangleMeshShape(this_00,trimesh,true,true);
    uVar1 = (this->m_allocatedCollisionShapes).m_size;
    if (uVar1 != (this->m_allocatedCollisionShapes).m_capacity) goto LAB_00149813;
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if (iVar4 <= (int)uVar1) goto LAB_00149813;
    if (iVar4 == 0) {
      ppbVar2 = (btCollisionShape **)0x0;
    }
    else {
      ppbVar2 = (btCollisionShape **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
      uVar1 = (this->m_allocatedCollisionShapes).m_size;
    }
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        ppbVar2[uVar3] = (this->m_allocatedCollisionShapes).m_data[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  else {
    btBvhTriangleMeshShape::btBvhTriangleMeshShape
              (this_00,trimesh,(bvh->super_btQuantizedBvh).m_useQuantization,false);
    local_38.m_floats[0] = 1.0;
    local_38.m_floats[1] = 1.0;
    local_38.m_floats[2] = 1.0;
    local_38.m_floats[3] = 0.0;
    btBvhTriangleMeshShape::setOptimizedBvh(this_00,bvh,&local_38);
    uVar1 = (this->m_allocatedCollisionShapes).m_size;
    if (uVar1 != (this->m_allocatedCollisionShapes).m_capacity) goto LAB_00149813;
    iVar4 = 1;
    if (uVar1 != 0) {
      iVar4 = uVar1 * 2;
    }
    if (iVar4 <= (int)uVar1) goto LAB_00149813;
    if (iVar4 == 0) {
      ppbVar2 = (btCollisionShape **)0x0;
    }
    else {
      ppbVar2 = (btCollisionShape **)btAlignedAllocInternal((long)iVar4 << 3,0x10);
      uVar1 = (this->m_allocatedCollisionShapes).m_size;
    }
    if (0 < (int)uVar1) {
      uVar3 = 0;
      do {
        ppbVar2[uVar3] = (this->m_allocatedCollisionShapes).m_data[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
    }
  }
  ptr = (this->m_allocatedCollisionShapes).m_data;
  if ((ptr != (btCollisionShape **)0x0) && ((this->m_allocatedCollisionShapes).m_ownsMemory == true)
     ) {
    btAlignedFreeInternal(ptr);
    uVar1 = (this->m_allocatedCollisionShapes).m_size;
  }
  (this->m_allocatedCollisionShapes).m_ownsMemory = true;
  (this->m_allocatedCollisionShapes).m_data = ppbVar2;
  (this->m_allocatedCollisionShapes).m_capacity = iVar4;
LAB_00149813:
  (this->m_allocatedCollisionShapes).m_data[(int)uVar1] = (btCollisionShape *)this_00;
  (this->m_allocatedCollisionShapes).m_size = uVar1 + 1;
  return this_00;
}

Assistant:

btBvhTriangleMeshShape* btCollisionWorldImporter::createBvhTriangleMeshShape(btStridingMeshInterface* trimesh, btOptimizedBvh* bvh)
{
	if (bvh)
	{
		btBvhTriangleMeshShape* bvhTriMesh = new btBvhTriangleMeshShape(trimesh,bvh->isQuantized(), false);
		bvhTriMesh->setOptimizedBvh(bvh);
		m_allocatedCollisionShapes.push_back(bvhTriMesh);
		return bvhTriMesh;
	}

	btBvhTriangleMeshShape* ts = new btBvhTriangleMeshShape(trimesh,true);
	m_allocatedCollisionShapes.push_back(ts);
	return ts;

}